

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.h
# Opt level: O2

string * __thiscall libchess::Move::to_str_abi_cxx11_(string *__return_storage_ptr__,Move *this)

{
  ushort uVar1;
  optional<libchess::PieceType> promotion_pt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  uVar1 = (ushort)this->value_;
  promotion_pt.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::PieceType> =
       (_Optional_base<libchess::PieceType,_true,_true>)&local_40;
  local_40._M_allocated_capacity._0_2_ = ((uVar1 & 0x38) << 5 | uVar1 & 7) + 0x3161;
  local_40._M_local_buf[2] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30.field_2._M_allocated_capacity._0_2_ = (uVar1 >> 1 & 0x700 | uVar1 >> 6 & 7) + 0x3161;
  local_30._M_string_length = 2;
  local_30.field_2._M_local_buf[2] = '\0';
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&promotion_pt,
                 &local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&promotion_pt);
  promotion_pt = promotion_piece_type(this);
  if (((ulong)promotion_pt.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
              super__Optional_payload_base<libchess::PieceType> >> 0x20 & 1) != 0) {
    PieceType::to_char((PieceType *)&promotion_pt);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_str() const {
        std::string move_str = from_square().to_str() + to_square().to_str();
        auto promotion_pt = promotion_piece_type();
        if (promotion_pt) {
            move_str += promotion_pt->to_char();
        }
        return move_str;
    }